

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O3

string * __thiscall
t_ocaml_generator::struct_member_copy_of
          (string *__return_storage_ptr__,t_ocaml_generator *this,t_type *type,string *what)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  t_type *ptVar3;
  pointer pcVar4;
  long lVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  ulong *puVar10;
  ulong uVar11;
  _Alloc_hider _Var12;
  undefined8 uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  string copy_of_v;
  string copy_of_k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  long local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar6 = (*(type->super_t_doc)._vptr_t_doc[0xb])(type);
  if (((char)iVar6 != '\0') ||
     (iVar6 = (*(type->super_t_doc)._vptr_t_doc[0xc])(type), (char)iVar6 != '\0')) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"#copy","");
    plVar7 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_150,0,(char *)0x0,(ulong)(what->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar9) {
      lVar5 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p == &local_150.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_002dd04c;
  }
  iVar6 = (*(type->super_t_doc)._vptr_t_doc[0x10])(type);
  if ((char)iVar6 == '\0') {
    iVar6 = (*(type->super_t_doc)._vptr_t_doc[0xf])(type);
    if ((char)iVar6 == '\0') {
      iVar6 = (*(type->super_t_doc)._vptr_t_doc[0xe])(type);
      if ((char)iVar6 == '\0') {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = (what->_M_dataplus)._M_p;
        paVar14 = &what->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 == paVar14) {
          uVar13 = *(undefined8 *)((long)&what->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar14->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar13;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = what->_M_string_length;
        (what->_M_dataplus)._M_p = (pointer)paVar14;
        what->_M_string_length = 0;
        (what->field_2)._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      }
      ptVar3 = *(t_type **)&type[1].super_t_doc.has_doc_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"x","");
      struct_member_copy_of(&local_150,this,ptVar3,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_150);
      if (iVar6 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = (what->_M_dataplus)._M_p;
        paVar14 = &what->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 == paVar14) {
          uVar13 = *(undefined8 *)((long)&what->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar14->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar13;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar14->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = what->_M_string_length;
        (what->_M_dataplus)._M_p = (pointer)paVar14;
        what->_M_string_length = 0;
        (what->field_2)._M_local_buf[0] = '\0';
      }
      else {
        paVar14 = &local_1b0.field_2;
        local_1b0._M_dataplus._M_p = (pointer)paVar14;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,"(List.map (fun x -> ","");
        std::operator+(&local_1f0,&local_1b0,&local_150);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,") ","");
        std::operator+(&local_1d0,&local_1f0,&local_130);
        std::operator+(&local_190,&local_1d0,what);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,")","");
        std::operator+(__return_storage_ptr__,&local_190,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        _Var12._M_p = local_1b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
          _Var12._M_p = local_1b0._M_dataplus._M_p;
        }
LAB_002dd031:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var12._M_p != paVar14) goto LAB_002dd036;
      }
    }
    else {
      ptVar3 = *(t_type **)&type[1].super_t_doc.has_doc_;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"k","");
      struct_member_copy_of(&local_150,this,ptVar3,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_150);
      if (iVar6 == 0) {
        paVar14 = &local_1d0.field_2;
        local_1d0._M_dataplus._M_p = (pointer)paVar14;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"(Hashtbl.copy ","");
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)(what->_M_dataplus)._M_p)
        ;
        paVar1 = &local_190.field_2;
        puVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_190.field_2._M_allocated_capacity = *puVar10;
          local_190.field_2._8_8_ = puVar8[3];
          local_190._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_190.field_2._M_allocated_capacity = *puVar10;
          local_190._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_190._M_string_length = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        paVar2 = &local_1f0.field_2;
        local_1f0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,")","");
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          uVar13 = local_190.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_1f0._M_string_length + local_190._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != paVar2) {
            uVar13 = local_1f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_1f0._M_string_length + local_190._M_string_length)
          goto LAB_002dcf1c;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_1f0,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
        }
        else {
LAB_002dcf1c:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_190,(ulong)local_1f0._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar9 = puVar8 + 2;
        if ((size_type *)*puVar8 == psVar9) {
          uVar13 = puVar8[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar13;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar8;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        }
        __return_storage_ptr__->_M_string_length = puVar8[1];
        *puVar8 = psVar9;
        puVar8[1] = 0;
        *(undefined1 *)psVar9 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        _Var12._M_p = local_1d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar1) {
          operator_delete(local_190._M_dataplus._M_p);
          _Var12._M_p = local_1d0._M_dataplus._M_p;
        }
        goto LAB_002dd031;
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v -> Hashtbl.add nh "
                 ,"");
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_150._M_dataplus._M_p)
      ;
      puVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_1b0.field_2._M_allocated_capacity = *puVar10;
        local_1b0.field_2._8_4_ = *(undefined4 *)(puVar8 + 3);
        local_1b0.field_2._12_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      }
      else {
        local_1b0.field_2._M_allocated_capacity = *puVar10;
        local_1b0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_1b0._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      paVar14 = &local_170.field_2;
      local_170._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170," true","");
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        uVar13 = local_1b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_170._M_string_length + local_1b0._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != paVar14) {
          uVar13 = local_170.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_170._M_string_length + local_1b0._M_string_length)
        goto LAB_002dcbee;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_170,0,(char *)0x0,(ulong)local_1b0._M_dataplus._M_p);
      }
      else {
LAB_002dcbee:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1b0,(ulong)local_170._M_dataplus._M_p);
      }
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      puVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_1f0.field_2._M_allocated_capacity = *puVar10;
        local_1f0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_1f0.field_2._M_allocated_capacity = *puVar10;
        local_1f0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_1f0._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      local_110 = &local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,") oh; nh) ","");
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        uVar13 = local_1f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_108 + local_1f0._M_string_length) {
        uVar13 = 0xf;
        if (local_110 != &local_100) {
          uVar13 = local_100._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_108 + local_1f0._M_string_length) goto LAB_002dcd0e;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_110,0,(char *)0x0,(ulong)local_1f0._M_dataplus._M_p);
      }
      else {
LAB_002dcd0e:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_110);
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      puVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_1d0.field_2._M_allocated_capacity = *puVar10;
        local_1d0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *puVar10;
        local_1d0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_1d0._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)(what->_M_dataplus)._M_p);
      puVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_190.field_2._M_allocated_capacity = *puVar10;
        local_190.field_2._8_8_ = puVar8[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *puVar10;
        local_190._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_190._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_190);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        lVar5 = plVar7[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar14) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      _Var12._M_p = local_130._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) goto LAB_002dd036;
    }
  }
  else {
    ptVar3 = *(t_type **)&type[1].super_t_doc.has_doc_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"k","");
    struct_member_copy_of(&local_150,this,ptVar3,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    ptVar3 = *(t_type **)&type[1].annotations_._M_t._M_impl;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"v","");
    struct_member_copy_of(&local_190,this,ptVar3,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_150);
    if ((iVar6 == 0) && (iVar6 = std::__cxx11::string::compare((char *)&local_190), iVar6 == 0)) {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"(Hashtbl.copy ","");
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)(what->_M_dataplus)._M_p);
      paVar14 = &local_1d0.field_2;
      puVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_1d0.field_2._M_allocated_capacity = *puVar10;
        local_1d0.field_2._8_8_ = puVar8[3];
        local_1d0._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *puVar10;
        local_1d0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_1d0._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      paVar1 = &local_1b0.field_2;
      local_1b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,")","");
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar14) {
        uVar13 = local_1d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_1b0._M_string_length + local_1d0._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != paVar1) {
          uVar13 = local_1b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_1b0._M_string_length + local_1d0._M_string_length)
        goto LAB_002dcfb0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1b0,0,(char *)0x0,(ulong)local_1d0._M_dataplus._M_p);
      }
      else {
LAB_002dcfb0:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1d0,(ulong)local_1b0._M_dataplus._M_p);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = puVar8 + 2;
      if ((size_type *)*puVar8 == psVar9) {
        uVar13 = puVar8[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar13;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar8;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = puVar8[1];
      *puVar8 = psVar9;
      puVar8[1] = 0;
      *(undefined1 *)psVar9 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar14) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      _Var12._M_p = local_1f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
LAB_002dca82:
        operator_delete(_Var12._M_p);
      }
    }
    else {
      local_110 = &local_100;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v -> Hashtbl.add nh "
                 ,"");
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_110,(ulong)local_150._M_dataplus._M_p);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_170.field_2._M_allocated_capacity = *puVar10;
        local_170.field_2._8_4_ = (undefined4)plVar7[3];
        local_170.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      }
      else {
        local_170.field_2._M_allocated_capacity = *puVar10;
        local_170._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_170._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," ","");
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        uVar13 = local_170.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_c8 + local_170._M_string_length) {
        uVar11 = 0xf;
        if (local_d0 != local_c0) {
          uVar11 = local_c0[0];
        }
        if (uVar11 < local_c8 + local_170._M_string_length) goto LAB_002dc780;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_d0,0,(char *)0x0,(ulong)local_170._M_dataplus._M_p);
      }
      else {
LAB_002dc780:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_d0);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      psVar9 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_130.field_2._M_allocated_capacity = *psVar9;
        local_130.field_2._8_8_ = puVar8[3];
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar9;
        local_130._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_130._M_string_length = puVar8[1];
      *puVar8 = psVar9;
      puVar8[1] = 0;
      *(undefined1 *)psVar9 = 0;
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_190._M_dataplus._M_p)
      ;
      paVar14 = &local_1b0.field_2;
      puVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_1b0.field_2._M_allocated_capacity = *puVar10;
        local_1b0.field_2._8_4_ = *(undefined4 *)(puVar8 + 3);
        local_1b0.field_2._12_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
        local_1b0._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_1b0.field_2._M_allocated_capacity = *puVar10;
        local_1b0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_1b0._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,") oh; nh) ","");
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != paVar14) {
        uVar13 = local_1b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_e8 + local_1b0._M_string_length) {
        uVar11 = 0xf;
        if (local_f0 != local_e0) {
          uVar11 = local_e0[0];
        }
        if (uVar11 < local_e8 + local_1b0._M_string_length) goto LAB_002dc8e6;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_f0,0,(char *)0x0,(ulong)local_1b0._M_dataplus._M_p);
      }
      else {
LAB_002dc8e6:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_f0);
      }
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      puVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_1f0.field_2._M_allocated_capacity = *puVar10;
        local_1f0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_1f0.field_2._M_allocated_capacity = *puVar10;
        local_1f0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_1f0._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)(what->_M_dataplus)._M_p);
      puVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_1d0.field_2._M_allocated_capacity = *puVar10;
        local_1d0.field_2._8_8_ = puVar8[3];
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *puVar10;
        local_1d0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_1d0._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        lVar5 = plVar7[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != paVar14) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      _Var12._M_p = (pointer)local_110;
      if (local_110 != &local_100) goto LAB_002dca82;
    }
    _Var12._M_p = local_190._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
LAB_002dd036:
      operator_delete(_Var12._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p == &local_150.field_2) {
    return __return_storage_ptr__;
  }
LAB_002dd04c:
  operator_delete(local_150._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

string t_ocaml_generator::struct_member_copy_of(t_type* type, string what) {
  if (type->is_struct() || type->is_xception()) {
    return what + string("#copy");
  }
  if (type->is_map()) {
    string copy_of_k = struct_member_copy_of(((t_map*)type)->get_key_type(), "k");
    string copy_of_v = struct_member_copy_of(((t_map*)type)->get_val_type(), "v");

    if (copy_of_k == "k" && copy_of_v == "v") {
      return string("(Hashtbl.copy ") + what + string(")");
    } else {
      return string(
                 "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v "
                 "-> Hashtbl.add nh ") + copy_of_k + string(" ") + copy_of_v + string(") oh; nh) ")
             + what + ")";
    }
  }
  if (type->is_set()) {
    string copy_of = struct_member_copy_of(((t_set*)type)->get_elem_type(), "k");

    if (copy_of == "k") {
      return string("(Hashtbl.copy ") + what + string(")");
    } else {
      return string(
                 "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v "
                 "-> Hashtbl.add nh ") + copy_of + string(" true") + string(") oh; nh) ") + what
             + ")";
    }
  }
  if (type->is_list()) {
    string copy_of = struct_member_copy_of(((t_list*)type)->get_elem_type(), "x");
    if (copy_of != "x") {
      return string("(List.map (fun x -> ") + copy_of + string(") ") + what + string(")");
    } else {
      return what;
    }
  }
  return what;
}